

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

string * __thiscall
helics::ActionMessage::to_string_abi_cxx11_(string *__return_storage_ptr__,ActionMessage *this)

{
  int iVar1;
  string sStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->flags & 0x40) == 0) {
    iVar1 = serializedByteCount(this);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(long)iVar1);
    toByteArray(this,(byte *)(__return_storage_ptr__->_M_dataplus)._M_p,(long)iVar1);
  }
  else {
    to_json_string_abi_cxx11_(&sStack_38,this);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ActionMessage::to_string() const
{
    std::string data;
    if (checkActionFlag(*this, use_json_serialization_flag)) {
        data = to_json_string();
    } else {
        auto size = serializedByteCount();
        data.resize(size);
        toByteArray(reinterpret_cast<std::byte*>(data.data()), size);
    }
    return data;
}